

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

TextureFormatInfo *
tcu::getTextureFormatInfo(TextureFormatInfo *__return_storage_ptr__,TextureFormat *format)

{
  ChannelType CVar1;
  ChannelOrder order;
  TextureSwizzle *pTVar2;
  float trueVal;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float trueVal_00;
  undefined1 local_b8 [16];
  Vec4 local_98;
  Vec4 local_88;
  Vec4 local_78;
  Vec4 local_68;
  Vector<bool,_4> local_4c;
  float local_48;
  undefined4 uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  CVar1 = format->type;
  if (CVar1 == SIGNED_INT_1010102_REV) {
    local_68.m_data[0] = -512.0;
    local_68.m_data[1] = -512.0;
    local_68.m_data[2] = -512.0;
    local_68.m_data[3] = -2.0;
    local_78.m_data[0] = 511.0;
    local_78.m_data[1] = 511.0;
    local_78.m_data[2] = 511.0;
    local_78.m_data[3] = 1.0;
    local_88.m_data[0] = 0.0009775171;
    local_88.m_data[1] = 0.0009775171;
    local_88.m_data[2] = 0.0009775171;
    local_88.m_data[3] = 0.33333334;
    local_98.m_data[0] = 0.5;
    local_98.m_data[1] = 0.5;
    local_98.m_data[2] = 0.5;
    local_98.m_data[3] = 0.5;
    goto LAB_0056ad2a;
  }
  if (CVar1 == UNSIGNED_INT_1010102_REV) {
    local_78.m_data[0] = 1023.0;
    local_78.m_data[1] = 1023.0;
    local_78.m_data[2] = 1023.0;
    local_78.m_data[3] = 3.0;
    local_88.m_data[0] = 0.0009775171;
    local_88.m_data[1] = 0.0009775171;
    local_88.m_data[2] = 0.0009775171;
    local_88.m_data[3] = 0.33333334;
    goto LAB_0056ad16;
  }
  order = format->order;
  if ((order == DS) || (order == D)) {
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 1.0;
    local_78.m_data[3] = 0.0;
    local_88.m_data[0] = 1.0;
    local_88.m_data[1] = 1.0;
    local_88.m_data[2] = 1.0;
    local_88.m_data[3] = 1.0;
    goto LAB_0056ad16;
  }
  if (CVar1 == UNORM_SHORT_5551 && order == RGBA) {
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.5;
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 1.0;
    local_78.m_data[3] = 1.5;
    local_88.m_data[0] = 1.0;
    local_88.m_data[1] = 1.0;
    local_88.m_data[2] = 1.0;
    local_88.m_data[3] = 1.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    goto LAB_0056ad2a;
  }
  switch(CVar1) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case SNORM_INT_1010102_REV:
    trueVal = 1.0;
    local_b8._0_12_ = ZEXT812(0xbf800000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case UNORM_INT_1010102_REV:
    trueVal = 1.0;
    break;
  case UNSIGNED_BYTE_44:
  case UNSIGNED_SHORT_4444:
    trueVal = 15.0;
    break;
  case UNSIGNED_SHORT_565:
    local_78.m_data[0] = 31.0;
    local_78.m_data[1] = 63.0;
    local_78.m_data[2] = 31.0;
    local_78.m_data[3] = 0.0;
    local_88.m_data[0] = 0.032258064;
    local_88.m_data[1] = 0.015873017;
    local_88.m_data[2] = 0.032258064;
    local_88.m_data[3] = 1.0;
    goto LAB_0056ad16;
  case UNSIGNED_SHORT_5551:
    local_78.m_data[0] = 31.0;
    local_78.m_data[1] = 31.0;
    local_78.m_data[2] = 31.0;
    local_78.m_data[3] = 1.0;
    local_88.m_data[0] = 0.032258064;
    local_88.m_data[1] = 0.032258064;
    local_88.m_data[2] = 0.032258064;
    local_88.m_data[3] = 1.0;
LAB_0056ad16:
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    goto LAB_0056ad2a;
  default:
    trueVal = 0.0;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    trueVal = 10000.0;
    break;
  case UNSIGNED_INT_999_E5_REV:
    trueVal = 100000.0;
    break;
  case SIGNED_INT8:
    trueVal = 127.0;
    local_b8._0_12_ = ZEXT812(0xc3000000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  case SIGNED_INT16:
    trueVal = 32767.0;
    local_b8._0_12_ = ZEXT812(0xc7000000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  case SIGNED_INT32:
    trueVal = 2.1474836e+09;
    local_b8._0_12_ = ZEXT812(0xcf000000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  case UNSIGNED_INT8:
    trueVal = 255.0;
    break;
  case UNSIGNED_INT16:
    trueVal = 65535.0;
    break;
  case UNSIGNED_INT24:
    trueVal = 16777215.0;
    break;
  case UNSIGNED_INT32:
    trueVal = 4.2949673e+09;
    break;
  case HALF_FLOAT:
    trueVal = 1000.0;
    local_b8._0_12_ = ZEXT812(0xc47a0000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  case FLOAT:
  case FLOAT64:
    trueVal = 100000.0;
    local_b8._0_12_ = ZEXT812(0xc7c35000);
    local_b8._12_4_ = 0;
    goto LAB_0056aeb6;
  }
  local_b8 = ZEXT816(0);
LAB_0056aeb6:
  pTVar2 = getChannelReadSwizzle(order);
  auVar3._0_4_ = -(uint)(-0x7ffffffd < (int)(pTVar2->components[0] ^ 0x80000000));
  auVar3._4_4_ = -(uint)(-0x7ffffffd < (int)(pTVar2->components[1] ^ 0x80000000));
  auVar3._8_4_ = -(uint)(-0x7ffffffd < (int)(pTVar2->components[2] ^ 0x80000000));
  auVar3._12_4_ = -(uint)(-0x7ffffffd < (int)(pTVar2->components[3] ^ 0x80000000));
  auVar3 = packssdw(auVar3,auVar3);
  auVar4._8_4_ = 0xffffffff;
  auVar4._0_8_ = 0xffffffffffffffff;
  auVar4._12_4_ = 0xffffffff;
  auVar3 = packsswb(auVar4 ^ auVar3,auVar4 ^ auVar3);
  local_4c.m_data = (bool  [4])(auVar3._0_4_ & (uint)DAT_005b64d0);
  trueVal_00 = 1.0 / (trueVal - (float)local_b8._0_4_);
  uStack_44 = 0x80000000;
  uStack_40 = local_b8._8_4_ ^ 0x80000000;
  uStack_3c = local_b8._12_4_ ^ 0x80000000;
  local_48 = -(float)local_b8._0_4_ * trueVal_00;
  select<float,4>((tcu *)&local_68,(float)local_b8._0_4_,0.0,&local_4c);
  select<float,4>((tcu *)&local_78,trueVal,0.0,&local_4c);
  select<float,4>((tcu *)&local_88,trueVal_00,1.0,&local_4c);
  select<float,4>((tcu *)&local_98,local_48,0.0,&local_4c);
LAB_0056ad2a:
  TextureFormatInfo::TextureFormatInfo
            (__return_storage_ptr__,&local_68,&local_78,&local_88,&local_98);
  return __return_storage_ptr__;
}

Assistant:

TextureFormatInfo getTextureFormatInfo (const TextureFormat& format)
{
	// Special cases.
	if (format.type == TextureFormat::UNSIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f),
								 Vec4(	  1023.0f,		 1023.0f,		 1023.0f,		 3.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f));
	if (format.type == TextureFormat::SIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	  -512.0f,		 -512.0f,		 -512.0f,		-2.0f),
								 Vec4(	   511.0f,		  511.0f,		  511.0f,		 1.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.5f,		    0.5f,		    0.5f,		 0.5f));
	else if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TextureFormatInfo(Vec4(0.0f,	0.0f,	0.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	1.0f),
								 Vec4(0.0f,	0.0f,	0.0f,	0.0f)); // Depth / stencil formats.
	else if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_SHORT_5551))
		return TextureFormatInfo(Vec4(0.0f, 0.0f, 0.0f, 0.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.0f),
								 Vec4(0.0f, 0.0f, 0.0f, 0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_5551)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 31.0f,		 31.0f,	1.0f),
								 Vec4(1.0f/31.f,	1.0f/31.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_565)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 63.0f,		 31.0f,	0.0f),
								 Vec4(1.0f/31.f,	1.0f/63.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));

	const Vec2						cRange		= getFloatChannelValueRange(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const float						scale		= 1.0f / (cRange[1] - cRange[0]);
	const float						bias		= -cRange[0] * scale;

	return TextureFormatInfo(select(cRange[0],	0.0f, chnMask),
							 select(cRange[1],	0.0f, chnMask),
							 select(scale,		1.0f, chnMask),
							 select(bias,		0.0f, chnMask));
}